

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::write<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char8_t value,
          basic_format_specs<char8_t> *specs,locale_ref loc)

{
  bool bVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar2;
  error_handler local_21;
  
  bVar1 = check_char_specs<char8_t,fmt::v8::detail::error_handler>(specs,&local_21);
  if (bVar1) {
    bVar2 = write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (out,value,specs);
  }
  else {
    bVar2 = write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_int>
                      (out,(write_int_arg<unsigned_int>)
                           ((ulong)(byte)value |
                           (ulong)*(uint *)(&DAT_00126180 +
                                           (*(ushort *)&specs->field_0x9 >> 2 & 0x1c)) << 0x20),
                       specs,loc);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}